

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigCone.c
# Opt level: O0

void Saig_ManPrintCones(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  printf("The format of this print-out: For each PO, x:a b=c+d+e, where \n");
  printf("- x is the time-frame counting back from the PO\n");
  printf("- a is the total number of registers in the COI of the PO so far\n");
  printf("- b is the number of registers in the COI of the PO in this time-frame\n");
  printf("- c is the number of registers in b that are new (appear for the first time)\n");
  printf("- d is the number of registers in b in common with the previous time-frame\n");
  printf("- e is the number of registers in b in common with other time-frames\n");
  Aig_ManSetCioIds(p);
  for (local_1c = 0; iVar1 = Saig_ManPoNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_1c);
    Saig_ManPrintConeOne(p,pObj_00);
  }
  return;
}

Assistant:

void Saig_ManPrintCones( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    printf( "The format of this print-out: For each PO, x:a b=c+d+e, where \n" );
    printf( "- x is the time-frame counting back from the PO\n" );
    printf( "- a is the total number of registers in the COI of the PO so far\n" );
    printf( "- b is the number of registers in the COI of the PO in this time-frame\n" );
    printf( "- c is the number of registers in b that are new (appear for the first time)\n" );
    printf( "- d is the number of registers in b in common with the previous time-frame\n" );
    printf( "- e is the number of registers in b in common with other time-frames\n" );
    Aig_ManSetCioIds( p );
    Saig_ManForEachPo( p, pObj, i )
        Saig_ManPrintConeOne( p, pObj );
}